

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.c
# Opt level: O2

int project_tube(float *f,int *i,int c)

{
  float fVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  
  lVar2 = 0;
  for (; 0 < c; c = c + -2) {
    fVar1 = *(float *)((long)f + lVar2) * 3.1415927;
    fVar7 = view_right - view_left;
    if (view_bottom - view_top <= view_right - view_left) {
      fVar7 = view_bottom - view_top;
    }
    dVar3 = (double)(fVar1 + fVar1 + 1.5707964);
    dVar4 = cos(dVar3);
    dVar3 = sin(dVar3);
    fVar1 = (1.0 - *(float *)((long)f + lVar2 + 4)) * 8.0 + 1.0;
    auVar5._0_4_ = (float)dVar4;
    auVar5._4_4_ = (float)dVar3;
    auVar5._8_8_ = 0;
    auVar6._4_4_ = fVar1;
    auVar6._0_4_ = fVar1;
    auVar6._8_4_ = fVar1;
    auVar6._12_4_ = fVar1;
    auVar6 = divps(auVar5,auVar6);
    *(ulong *)((long)i + lVar2) =
         CONCAT44((int)((view_bottom + view_top) * 0.5 + fVar7 * 0.5 * auVar6._4_4_),
                  (int)((view_right + view_left) * 0.5 + fVar7 * 0.5 * auVar6._0_4_));
    lVar2 = lVar2 + 8;
  }
  return -1;
}

Assistant:

static int project_tube(float *f, int *i, int c)
{
   while (c > 0) {
      float ang = f[0] * M_PI * 2.0 + M_PI / 2.0;

      float xsize = view_right - view_left;
      float ysize = view_bottom - view_top;
      float size = MIN(xsize, ysize) / 2.0;

      float x = cos(ang);
      float y = sin(ang);

      float z = 1.0 + (1.0 - f[1]) * 8.0;

      i[0] = x/z * size + (view_left + view_right) / 2.0;
      i[1] = y/z * size + (view_top + view_bottom) / 2.0;

      f += 2;
      i += 2;
      c -= 2;
   }

   return TRUE;
}